

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

loss_function * getLossFunction(vw *all,string *funcName,float function_parameter)

{
  int iVar1;
  loss_function *plVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string *in_RSI;
  long *in_RDI;
  stringstream __msg;
  float *in_stack_fffffffffffffdc8;
  quantileloss *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int plineNumber;
  char *in_stack_fffffffffffffdf8;
  vw_exception *in_stack_fffffffffffffe00;
  stringstream local_1b8 [16];
  ostream local_1a8;
  long *local_10;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  local_10 = in_RDI;
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)in_RSI), iVar1 == 0)) {
    plVar2 = (loss_function *)operator_new(8);
    memset(plVar2,0,8);
    squaredloss::squaredloss((squaredloss *)in_stack_fffffffffffffdd0);
    return plVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if (iVar1 == 0) {
    plVar2 = (loss_function *)operator_new(8);
    memset(plVar2,0,8);
    classic_squaredloss::classic_squaredloss((classic_squaredloss *)in_stack_fffffffffffffdd0);
    return plVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if (iVar1 == 0) {
    plVar2 = (loss_function *)operator_new(8);
    memset(plVar2,0,8);
    hingeloss::hingeloss((hingeloss *)in_stack_fffffffffffffdd0);
    return plVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if (iVar1 == 0) {
    if ((code *)local_10[8] != noop_mm) {
      *(undefined4 *)(*local_10 + 0x68) = 0xc2480000;
      *(undefined4 *)(*local_10 + 0x6c) = 0x42480000;
    }
    plVar2 = (loss_function *)operator_new(8);
    memset(plVar2,0,8);
    logloss::logloss((logloss *)in_stack_fffffffffffffdd0);
    return plVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if (((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)in_RSI), iVar1 != 0)) &&
     (iVar1 = std::__cxx11::string::compare((char *)in_RSI), iVar1 != 0)) {
    iVar1 = std::__cxx11::string::compare((char *)in_RSI);
    if (iVar1 == 0) {
      if ((code *)local_10[8] != noop_mm) {
        *(undefined4 *)(*local_10 + 0x68) = 0xc2480000;
        *(undefined4 *)(*local_10 + 0x6c) = 0x42480000;
      }
      plVar2 = (loss_function *)operator_new(8);
      memset(plVar2,0,8);
      poisson_loss::poisson_loss((poisson_loss *)in_stack_fffffffffffffdd0);
      return plVar2;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(&local_1a8,"Invalid loss function name: \'");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::operator<<(poVar3,"\' Bailing!");
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,plineNumber,
               in_stack_fffffffffffffde8);
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  plVar2 = (loss_function *)operator_new(0x10);
  quantileloss::quantileloss(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  return plVar2;
}

Assistant:

loss_function* getLossFunction(vw& all, string funcName, float function_parameter)
{
  if (funcName.compare("squared") == 0 || funcName.compare("Huber") == 0)
    return new squaredloss();
  else if (funcName.compare("classic") == 0)
    return new classic_squaredloss();
  else if (funcName.compare("hinge") == 0)
    return new hingeloss();
  else if (funcName.compare("logistic") == 0)
  {
    if (all.set_minmax != noop_mm)
    {
      all.sd->min_label = -50;
      all.sd->max_label = 50;
    }
    return new logloss();
  }
  else if (funcName.compare("quantile") == 0 || funcName.compare("pinball") == 0 || funcName.compare("absolute") == 0)
  {
    return new quantileloss(function_parameter);
  }
  else if (funcName.compare("poisson") == 0)
  {
    if (all.set_minmax != noop_mm)
    {
      all.sd->min_label = -50;
      all.sd->max_label = 50;
    }
    return new poisson_loss();
  }
  else
    THROW("Invalid loss function name: \'" << funcName << "\' Bailing!");
}